

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O1

void __thiscall
FIX::HttpConnection::processResetSessions
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  Parameters *this_00;
  _func_int **pp_Var1;
  undefined *puVar2;
  int iVar3;
  const_iterator cVar4;
  string *psVar5;
  Session *this_01;
  TAG *pTVar6;
  long *plVar7;
  size_t sVar8;
  _func_int **pp_Var9;
  ostream *poVar10;
  bool bVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar12;
  HttpMessage copy;
  H2 h2;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  A a;
  string local_5f0;
  stringstream *local_5d0;
  string local_5c8;
  HttpMessage local_5a8;
  undefined1 local_558 [432];
  ostream *local_3a8;
  undefined1 local_3a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388 [25];
  ostream *local_1f0;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1d0 [26];
  
  HttpMessage::HttpMessage(&local_5a8,request);
  local_3a0._0_8_ = local_3a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"confirm","");
  this_00 = &local_5a8.m_parameters;
  local_5d0 = h;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_3a0);
  if ((_Rb_tree_header *)cVar4._M_node == &local_5a8.m_parameters._M_t._M_impl.super__Rb_tree_header
     ) {
    bVar11 = false;
  }
  else {
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"confirm","");
    psVar5 = HttpMessage::getParameter(&local_5a8,&local_5c8);
    iVar3 = std::__cxx11::string::compare((char *)psVar5);
    bVar11 = iVar3 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  if (bVar11) {
    Session::getSessions();
    for (; (_Rb_tree_node_base *)local_388[0]._0_8_ != (_Rb_tree_node_base *)(local_3a0 + 8);
        local_388[0]._0_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_388[0]._0_8_)) {
      this_01 = Session::lookupSession((SessionID *)(local_388[0]._0_8_ + 0x20));
      Session::reset(this_01);
    }
    local_558._0_8_ = local_558 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"confirm","");
    pVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&this_00->_M_t,(key_type *)local_558);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
    if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
      operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
    }
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                 *)local_3a0);
    if (bVar11) {
      poVar10 = (ostream *)(local_5d0 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"<META http-equiv=\'refresh\' content=2;URL=\'",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/\'>",3);
      poVar10 = (ostream *)(b + 0x10);
      HTML::CENTER::CENTER((CENTER *)local_3a0,poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(local_1f0,">",1);
      HTML::H2::H2((H2 *)local_558,poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
      HTML::A::A((A *)local_1e8,poVar10);
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"/","");
      pTVar6 = &HTML::A::href((A *)local_1e8,&local_5f0)->super_TAG;
      HTML::TAG::text<char[9]>(pTVar6,(char (*) [9])0x1cb410);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," have been reset",0x10);
      HTML::TAG::~TAG((TAG *)local_558);
      goto LAB_0017d605;
    }
  }
  poVar10 = (ostream *)(b + 0x10);
  HTML::CENTER::CENTER((CENTER *)local_3a0,poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(local_1f0,">",1);
  HTML::H2::H2((H2 *)local_558,poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"Are you sure you want to reset all sessions ?",0x2d);
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TAG::~TAG((TAG *)local_3a0);
  HTML::CENTER::CENTER((CENTER *)local_3a0,poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(local_1f0,">",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
  HTML::A::A((A *)local_558,poVar10);
  HttpMessage::toString_abi_cxx11_(&local_5f0,request);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_5f0);
  pp_Var1 = (_func_int **)(local_1e8 + 0x10);
  pp_Var9 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var9) {
    local_1e8._16_8_ = *pp_Var9;
    aaStack_1d0[0]._0_8_ = plVar7[3];
    local_1e8._0_8_ = pp_Var1;
  }
  else {
    local_1e8._16_8_ = *pp_Var9;
    local_1e8._0_8_ = (_func_int **)*plVar7;
  }
  local_1e8._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pTVar6 = &HTML::A::href((A *)local_558,(string *)local_1e8)->super_TAG;
  HTML::TAG::text<char[20]>(pTVar6,(char (*) [20])"YES, reset sessions");
  if ((_func_int **)local_1e8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_558);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
  puVar2 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
  }
  else {
    sVar8 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,puVar2,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
  HTML::A::A((A *)local_558,poVar10);
  local_1e8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"/","");
  pTVar6 = &HTML::A::href((A *)local_558,(string *)local_1e8)->super_TAG;
  HTML::TAG::text<char[26]>(pTVar6,(char (*) [26])"NO, do not reset sessions");
  if ((_func_int **)local_1e8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
LAB_0017d605:
  HTML::TAG::~TAG((TAG *)local_3a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&this_00->_M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.m_root._M_dataplus._M_p != &local_5a8.m_root.field_2) {
    operator_delete(local_5a8.m_root._M_dataplus._M_p,
                    local_5a8.m_root.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HttpConnection::processResetSessions(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  try {
    HttpMessage copy = request;

    bool confirm = false;
    if (copy.hasParameter("confirm") && copy.getParameter("confirm") != "0") {
      confirm = true;
      std::set<SessionID> sessions = Session::getSessions();
      std::set<SessionID>::iterator session;
      for (session = sessions.begin(); session != sessions.end(); ++session) {
        Session::lookupSession(*session)->reset();
      }
      copy.removeParameter("confirm");
    }

    if (confirm) {
      h << "<META http-equiv='refresh' content=2;URL='" << "/'>";
      CENTER center(b);
      center.text();
      H2 h2(b);
      h2.text();
      {
        A a(b);
        a.href("/").text("Sessions");
      }
      b << " have been reset";
    } else {
      {
        CENTER center(b);
        center.text();
        H2 h2(b);
        h2.text();
        b << "Are you sure you want to reset all sessions ?";
      }
      {
        CENTER center(b);
        center.text();
        b << "[";
        {
          A a(b);
          a.href(request.toString() + "?confirm=1").text("YES, reset sessions");
        }
        b << "]" << NBSP << "[";
        {
          A a(b);
          a.href("/").text("NO, do not reset sessions");
        }
        b << "]";
      }
    }
  } catch (std::exception &e) {
    b << e.what();
  }
}